

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O0

void __thiscall pmx::PmxVertexSkinningBDEF4::PmxVertexSkinningBDEF4(PmxVertexSkinningBDEF4 *this)

{
  PmxVertexSkinningBDEF4 *this_local;
  
  PmxVertexSkinning::PmxVertexSkinning(&this->super_PmxVertexSkinning);
  (this->super_PmxVertexSkinning)._vptr_PmxVertexSkinning = (_func_int **)&PTR_Read_01018ba0;
  this->bone_index1 = 0;
  this->bone_index2 = 0;
  this->bone_index3 = 0;
  this->bone_index4 = 0;
  this->bone_weight1 = 0.0;
  this->bone_weight2 = 0.0;
  this->bone_weight3 = 0.0;
  this->bone_weight4 = 0.0;
  return;
}

Assistant:

PmxVertexSkinningBDEF4()
			: bone_index1(0)
			, bone_index2(0)
			, bone_index3(0)
			, bone_index4(0)
			, bone_weight1(0.0f)
			, bone_weight2(0.0f)
			, bone_weight3(0.0f)
			, bone_weight4(0.0f)
		{}